

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O1

TPZSFMatrix<long_double> * __thiscall
TPZSFMatrix<long_double>::operator=(TPZSFMatrix<long_double> *this,TPZSFMatrix<long_double> *A)

{
  longdouble lVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint extraout_var_01;
  longdouble *plVar4;
  undefined4 extraout_var_02;
  int extraout_var_03;
  longdouble *plVar5;
  longdouble *plVar6;
  
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  iVar3 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(A);
  if (CONCAT44(extraout_var,iVar2) != CONCAT44(extraout_var_00,iVar3)) {
    if (this->fElem != (longdouble *)0x0) {
      operator_delete(this->fElem,0x10);
    }
    iVar2 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x4b])();
    plVar4 = (longdouble *)
             operator_new__(-(ulong)(extraout_var_01 >> 0x1c != 0) |
                            CONCAT44(extraout_var_01,iVar2) << 4);
    this->fElem = plVar4;
  }
  iVar2 = (*(A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])(A);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = CONCAT44(extraout_var_02,iVar2);
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = CONCAT44(extraout_var_02,iVar2);
  plVar4 = A->fElem;
  plVar6 = this->fElem;
  iVar2 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])(this);
  if (CONCAT44(extraout_var_03,iVar2) != 0 && -1 < extraout_var_03) {
    plVar5 = plVar6 + CONCAT44(extraout_var_03,iVar2);
    do {
      lVar1 = *plVar4;
      plVar4 = plVar4 + 1;
      *plVar6 = lVar1;
      plVar6 = plVar6 + 1;
    } while (plVar6 < plVar5);
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed;
  return this;
}

Assistant:

TPZSFMatrix<TVar> &
TPZSFMatrix<TVar> ::operator=(const TPZSFMatrix<TVar>  &A )
{
	if ( this->Dim() != A.Dim() )
    {
		if ( fElem != NULL )
        {
			delete( fElem );
        }
        int64_t size = A.Size();
		fElem = new TVar[ size ] ;
		if ( fElem == NULL )
			TPZMatrix<TVar> ::Error(__PRETTY_FUNCTION__, "Operator= <memory allocation error>." );
    }
	
	this->fRow = this->fCol =  A.Dim();
	
	// Copia a matriz
	TVar *src = A.fElem;
	TVar *dst = fElem;
	TVar *end = &fElem[ Size() ];
	while ( dst < end )
		*dst++ = *src++;
	
	this->fDecomposed = A.fDecomposed;
	
	return *this;
}